

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O1

QRegularExpression * __thiscall
QCache<QString,_QRegularExpression>::relink(QCache<QString,_QRegularExpression> *this,QString *key)

{
  Chain *pCVar1;
  Node *pNVar2;
  QRegularExpression *pQVar3;
  
  if ((this->d).size != 0) {
    pNVar2 = QHashPrivate::Data<QCache<QString,_QRegularExpression>::Node>::findNode<QString>
                       (&this->d,key);
    if (pNVar2 == (Node *)0x0) {
      pQVar3 = (QRegularExpression *)0x0;
    }
    else {
      if ((Node *)(this->chain).next != pNVar2) {
        pCVar1 = (pNVar2->super_Chain).prev;
        pCVar1->next = (pNVar2->super_Chain).next;
        ((pNVar2->super_Chain).next)->prev = pCVar1;
        (pNVar2->super_Chain).next = (this->chain).next;
        ((this->chain).next)->prev = &pNVar2->super_Chain;
        (pNVar2->super_Chain).prev = &this->chain;
        (this->chain).next = &pNVar2->super_Chain;
      }
      pQVar3 = (pNVar2->value).t;
    }
    return pQVar3;
  }
  return (QRegularExpression *)0x0;
}

Assistant:

inline bool isEmpty() const noexcept { return !d.size; }